

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall Potassco::ProgramOptions::SyntaxError::~SyntaxError(SyntaxError *this)

{
  *(undefined ***)&this->super_Error = &PTR__SyntaxError_0012a958;
  std::__cxx11::string::~string((string *)&this->key_);
  std::logic_error::~logic_error((logic_error *)this);
  return;
}

Assistant:

~SyntaxError() throw () {}